

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void __thiscall duckdb::Vector::Vector(Vector *this,LogicalType *type_p,data_ptr_t dataptr)

{
  bool bVar1;
  InternalException *this_00;
  long in_RDX;
  undefined1 *in_RDI;
  string *in_stack_ffffffffffffff68;
  LogicalType *in_stack_ffffffffffffff70;
  allocator local_49;
  string local_48 [48];
  long local_18;
  
  *in_RDI = 0;
  local_18 = in_RDX;
  LogicalType::LogicalType(in_stack_ffffffffffffff70,(LogicalType *)in_stack_ffffffffffffff68);
  *(long *)(in_RDI + 0x20) = local_18;
  ValidityMask::ValidityMask((ValidityMask *)0x3dbc1c);
  shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr
            ((shared_ptr<duckdb::VectorBuffer,_true> *)0x3dbc31);
  shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr
            ((shared_ptr<duckdb::VectorBuffer,_true> *)0x3dbc46);
  if (local_18 != 0) {
    bVar1 = LogicalType::IsValid(in_stack_ffffffffffffff70);
    if (!bVar1) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_48,"Cannot create a vector of type INVALID!",&local_49);
      InternalException::InternalException(this_00,in_stack_ffffffffffffff68);
      __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
    }
  }
  return;
}

Assistant:

Vector::Vector(LogicalType type_p, data_ptr_t dataptr)
    : vector_type(VectorType::FLAT_VECTOR), type(std::move(type_p)), data(dataptr) {
	if (dataptr && !type.IsValid()) {
		throw InternalException("Cannot create a vector of type INVALID!");
	}
}